

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O0

Vec4 __thiscall deqp::QuadGrid::getUserAttrib(QuadGrid *this,int attribNdx,float sx,float sy)

{
  const_reference mtx;
  int in_EDX;
  undefined4 in_register_00000034;
  Vector<float,_4> VVar1;
  Vec4 VVar2;
  Vector<float,_4> local_34;
  float local_24;
  float local_20;
  float sy_local;
  float sx_local;
  int attribNdx_local;
  QuadGrid *this_local;
  
  _sx_local = CONCAT44(in_register_00000034,attribNdx);
  local_24 = sy;
  local_20 = sx;
  this_local = this;
  mtx = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
        operator[]((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
                   (_sx_local + 0x20),(long)in_EDX);
  tcu::Vector<float,_4>::Vector(&local_34,local_20,local_24,0.0,1.0);
  VVar1 = tcu::operator*((tcu *)this,mtx,&local_34);
  VVar2.m_data[0] = VVar1.m_data[0];
  VVar2.m_data[1] = VVar1.m_data[1];
  VVar2.m_data[2] = VVar1.m_data[2];
  VVar2.m_data[3] = VVar1.m_data[3];
  return (Vec4)VVar2.m_data;
}

Assistant:

inline Vec4 QuadGrid::getUserAttrib(int attribNdx, float sx, float sy) const
{
	// homogeneous normalized screen-space coordinates
	return m_userAttribTransforms[attribNdx] * Vec4(sx, sy, 0.0f, 1.0f);
}